

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijectionmap.h
# Opt level: O0

size_t __thiscall
Common::SerialBijectionMap<ICM::Object_*>::_insert
          (SerialBijectionMap<ICM::Object_*> *this,Object **key)

{
  mapped_type mVar1;
  value_type pOVar2;
  bool bVar3;
  reference pvVar4;
  mapped_type *pmVar5;
  reference ppOVar6;
  size_t id;
  Object **key_local;
  SerialBijectionMap<ICM::Object_*> *this_local;
  
  bVar3 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->destroyable);
  if (bVar3) {
    mVar1 = this->currcount;
    pmVar5 = std::
             map<ICM::Object_*,_unsigned_long,_std::less<ICM::Object_*>,_std::allocator<std::pair<ICM::Object_*const,_unsigned_long>_>_>
             ::operator[](&this->keymap,key);
    *pmVar5 = mVar1;
    std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::push_back(&this->data,key);
    this->currcount = this->currcount + 1;
    this_local = (SerialBijectionMap<ICM::Object_*> *)(this->currcount - 1);
  }
  else {
    pvVar4 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::front(&this->destroyable);
    this_local = (SerialBijectionMap<ICM::Object_*> *)*pvVar4;
    pmVar5 = std::
             map<ICM::Object_*,_unsigned_long,_std::less<ICM::Object_*>,_std::allocator<std::pair<ICM::Object_*const,_unsigned_long>_>_>
             ::operator[](&this->keymap,key);
    *pmVar5 = (mapped_type)this_local;
    pOVar2 = *key;
    ppOVar6 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::operator[]
                        (&this->data,(size_type)this_local);
    *ppOVar6 = pOVar2;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&this->destroyable);
  }
  return (size_t)this_local;
}

Assistant:

size_t _insert(const _KTy &key) {
		if (destroyable.empty()) {
			keymap[key] = currcount;
			data.push_back(key);
			currcount++;
			return currcount - 1;
		}
		else {
			size_t id = destroyable.front();
			keymap[key] = id;
			data[id] = key;
			destroyable.pop_front();
			return id;
		}
	}